

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMf.c
# Opt level: O3

void Mf_ManComputeMapping(Mf_Man_t *p)

{
  uint *__src;
  ushort uVar1;
  uint uVar2;
  Mf_Obj_t *pMVar3;
  Jf_Par_t *pJVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  Gia_Man_t *pGVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  char *pTitle;
  uint *pCut;
  uint *puVar14;
  ulong uVar15;
  uint *pCut_00;
  int iVar16;
  float fVar17;
  float fVar18;
  undefined1 local_338 [776];
  
  pGVar9 = p->pGia;
  if (0 < pGVar9->nObjs) {
    uVar15 = 0;
    do {
      if ((~*(uint *)(pGVar9->pObjs + uVar15) & 0x1fffffff) != 0 &&
          -1 < (int)*(uint *)(pGVar9->pObjs + uVar15)) {
        pMVar3 = p->pLfObjs;
        uVar10 = pMVar3[uVar15].iCutSet >> 0x10;
        if (((int)uVar10 < 0) || ((p->vPages).nSize <= (int)uVar10)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        iVar6 = -1;
        puVar14 = (uint *)((ulong)((pMVar3[uVar15].iCutSet & 0xffffU) << 2) +
                          (long)(p->vPages).pArray[uVar10]);
        if ((p->fUseEla != 0) && (0xffff < *(uint *)&pMVar3[uVar15].field_0xc)) {
          iVar6 = Mf_CutDeref_rec(p,(int *)(puVar14 + 1));
        }
        if ((int)*puVar14 < 1) {
          __assert_fail("pCutBest != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaMf.c"
                        ,0x605,"void Mf_ObjComputeBestCut(Mf_Man_t *, int)");
        }
        __src = puVar14 + 1;
        uVar10 = 1000000000;
        iVar16 = 0;
        fVar18 = 1e+09;
        pCut = (uint *)0x0;
        uVar12 = 0;
        pCut_00 = __src;
        do {
          uVar2 = *pCut_00;
          uVar11 = uVar2 & 0x1f;
          if ((uVar11 == 1) && (uVar15 == pCut_00[1])) {
            __assert_fail("!Mf_CutIsTriv(pCut, iObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaMf.c"
                          ,0x5ff,"void Mf_ObjComputeBestCut(Mf_Man_t *, int)");
          }
          pJVar4 = p->pPars;
          if (pJVar4->nLutSize < (int)uVar11) {
            __assert_fail("Mf_CutSize(pCut) <= p->pPars->nLutSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaMf.c"
                          ,0x600,"void Mf_ObjComputeBestCut(Mf_Man_t *, int)");
          }
          if (p->fUseEla == 0) {
            if (uVar11 == 0) {
              iVar7 = 0;
              fVar17 = 0.0;
              uVar12 = 1;
            }
            else {
              fVar17 = 0.0;
              uVar13 = 0;
              uVar12 = 0;
              do {
                uVar1 = *(ushort *)&p->pLfObjs[(int)pCut_00[uVar13 + 1]].field_0xc;
                uVar5 = (uint)uVar1;
                if (uVar1 < uVar12) {
                  uVar5 = uVar12;
                }
                uVar12 = uVar5;
                fVar17 = fVar17 + p->pLfObjs[(int)pCut_00[uVar13 + 1]].Flow;
                uVar13 = uVar13 + 1;
              } while ((uVar2 & 0x1f) != uVar13);
              uVar12 = uVar12 + 1;
              iVar7 = 0;
              if (uVar11 != 1) {
                if (pJVar4->fGenCnf == 0) {
                  if (pJVar4->fOptEdge == 0) {
                    iVar7 = 1;
                  }
                  else {
                    iVar7 = uVar11 + pJVar4->nAreaTuner;
                  }
                }
                else {
                  if ((p->vCnfSizes).nSize <= (int)(uVar2 >> 6)) goto LAB_006ea5cf;
                  iVar7 = (p->vCnfSizes).pArray[uVar2 >> 6];
                }
              }
            }
            fVar17 = (float)iVar7 + fVar17;
          }
          else {
            iVar7 = Mf_CutRef_rec(p,(int *)pCut_00);
            iVar8 = Mf_CutDeref_rec(p,(int *)pCut_00);
            if (iVar7 != iVar8) {
              __assert_fail("Ela1 == Ela2",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaMf.c"
                            ,0x5e2,"int Mf_CutAreaDerefed(Mf_Man_t *, int *)");
            }
            fVar17 = (float)iVar7;
          }
          if (pCut == (uint *)0x0) {
LAB_006ea385:
            pCut = pCut_00;
            fVar18 = fVar17;
            uVar10 = uVar12;
          }
          else if ((fVar17 < fVar18) ||
                  (((fVar18 == fVar17 && (!NAN(fVar18) && !NAN(fVar17))) && (uVar12 < uVar10))))
          goto LAB_006ea385;
          iVar16 = iVar16 + 1;
          pCut_00 = pCut_00 + (ulong)(*pCut_00 & 0x1f) + 1;
        } while (iVar16 < (int)*puVar14);
        if ((p->fUseEla == 0) || (*(uint *)&pMVar3[uVar15].field_0xc < 0x10000)) {
          *(uint *)&pMVar3[uVar15].field_0xc = *(uint *)&pMVar3[uVar15].field_0xc & 0xffff;
        }
        else {
          iVar6 = Mf_CutRef_rec(p,(int *)pCut);
        }
        if (iVar6 < -1) {
          __assert_fail("Value1 >= Value2",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaMf.c"
                        ,0x60a,"void Mf_ObjComputeBestCut(Mf_Man_t *, int)");
        }
        if (p->fUseEla != 0) {
          uVar12 = *pCut & 0x1f;
          if (uVar12 == 0) {
            uVar10 = 1;
          }
          else {
            uVar13 = 0;
            uVar10 = 0;
            do {
              uVar1 = *(ushort *)&p->pLfObjs[(int)pCut[uVar13 + 1]].field_0xc;
              uVar2 = (uint)uVar1;
              if (uVar1 < uVar10) {
                uVar2 = uVar10;
              }
              uVar10 = uVar2;
              uVar13 = uVar13 + 1;
            } while (uVar12 != uVar13);
            uVar10 = uVar10 + 1;
            if (((uVar12 != 1) && (p->pPars->fGenCnf != 0)) &&
               ((p->vCnfSizes).nSize <= (int)(*pCut >> 6))) {
LAB_006ea5cf:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                            ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
          }
        }
        *(short *)&pMVar3[uVar15].field_0xc = (short)uVar10;
        pMVar3[uVar15].Flow = fVar18 / p->pLfObjs[uVar15].nFlowRefs;
        if (pCut <= puVar14) {
          __assert_fail("pCuts < pCut",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaMf.c"
                        ,0x2b6,"void Mf_ObjSetBestCut(int *, int *)");
        }
        if (__src < pCut) {
          uVar10 = *pCut;
          uVar13 = ((long)pCut - (long)__src) * 0x40000000 >> 0x1e & 0xfffffffffffffffc;
          memcpy(local_338,__src,uVar13);
          memmove(__src,pCut,(ulong)(uVar10 & 0x1f) * 4 + 4);
          memcpy(__src + (ulong)(uVar10 & 0x1f) + 1,local_338,uVar13);
        }
      }
      uVar15 = uVar15 + 1;
      pGVar9 = p->pGia;
    } while ((long)uVar15 < (long)pGVar9->nObjs);
  }
  Mf_ManSetMapRefs(p);
  if (p->fUseEla == 0) {
    pTitle = "Area ";
    if (p->Iter == 0) {
      pTitle = "Delay";
    }
  }
  else {
    pTitle = "Ela  ";
  }
  Mf_ManPrintStats(p,pTitle);
  return;
}

Assistant:

void Mf_ManComputeMapping( Mf_Man_t * p )
{
    int i;
    Gia_ManForEachAndId( p->pGia, i )
        Mf_ObjComputeBestCut( p, i );
    Mf_ManSetMapRefs( p );
    Mf_ManPrintStats( p, (char *)(p->fUseEla ? "Ela  " : (p->Iter ? "Area " : "Delay")) );
}